

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall Js::LocalsWalker::GetLocal(LocalsWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Type pVVar1;
  int iVar2;
  Type *ppVVar3;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int iVar4;
  
  this_00 = this->pVarWalkers;
  if ((this_00 !=
       (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (0 < (this_00->
          super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
          count)) {
    iVar4 = 0;
    do {
      ppVVar3 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar4);
      pVVar1 = *ppVVar3;
      if ((this->frameWalkerFlags & 1) != 0) {
        if (UIGroupType_Param < pVVar1->groupType) {
          return 0;
        }
        if ((0x13U >> (pVVar1->groupType & 0x1f) & 1) == 0) {
          return 0;
        }
      }
      iVar2 = (*(pVVar1->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])
                        (pVVar1);
      if (i < iVar2) {
        iVar4 = (**(pVVar1->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase)
                          (pVVar1,(ulong)(uint)i,pResolvedObject);
        return iVar4;
      }
      iVar4 = iVar4 + 1;
      this_00 = this->pVarWalkers;
      i = i - iVar2;
    } while (iVar4 < (this_00->
                     super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return 0;
}

Assistant:

BOOL LocalsWalker::GetLocal(int i, ResolvedObject* pResolvedObject)
    {
        if (!pVarWalkers || pVarWalkers->Count() == 0)
        {
            return FALSE;
        }

        for (int j = 0; j < pVarWalkers->Count(); ++j)
        {
            VariableWalkerBase *variableWalker = pVarWalkers->Item(j);

            if (!ShouldMakeGroups() || !variableWalker->IsInGroup())
            {
                int count = variableWalker->GetChildrenCount();

                if (i < count)
                {
                    return variableWalker->Get(i, pResolvedObject);
                }
                i -= count;
            }
            else
            {
                // We've finished with all walkers for the current locals level so
                // break out in order to handle the groups.
                break;
            }
        }

        return FALSE;
    }